

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O3

void __thiscall Neuron_testApply_Test::TestBody(Neuron_testApply_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  float fVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Neuron n;
  float local_b8;
  undefined4 uStack_b4;
  Message local_b0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  string local_98;
  Neuron local_78;
  
  Neuron::Neuron(&local_78,10.0,1.0,50.0);
  local_b0.ss_.ptr_._0_4_ = 0;
  local_b8 = Neuron::syn(&local_78);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_98,"0","n.syn()",(int *)&local_b0,&local_b8);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_b0);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (CONCAT44(local_b0.ss_.ptr_._4_4_,local_b0.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_b0.ss_.ptr_._4_4_,local_b0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_b0.ss_.ptr_._4_4_,local_b0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fVar3 = Neuron::mem(&local_78);
  local_b0.ss_.ptr_._0_4_ = CONCAT31(local_b0.ss_.ptr_._1_3_,fVar3 < 0.0);
  local_a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (0.0 <= fVar3) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_b0,(AssertionResult *)"n.mem() < 0","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x60,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                      (char)local_98._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p) !=
        &local_98.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p));
    }
    if (CONCAT44(uStack_b4,local_b8) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(uStack_b4,local_b8) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(uStack_b4,local_b8) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Neuron::apply(&local_78,100.0,(Connection *)0x0);
  local_b0.ss_.ptr_._0_4_ = 100;
  local_b8 = Neuron::syn(&local_78);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&local_98,"100","n.syn()",(int *)&local_b0,&local_b8);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_b0);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (CONCAT44(local_b0.ss_.ptr_._4_4_,local_b0.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_b0.ss_.ptr_._4_4_,local_b0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_b0.ss_.ptr_._4_4_,local_b0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
  ::~vector(&local_78.m_watchFor);
  if (local_78.m_incomingSpikes.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_incomingSpikes.
                    super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.m_connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_connections.
                    super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Neuron, testApply)
{
    Neuron n;
    EXPECT_EQ(0, n.syn());
    EXPECT_TRUE(n.mem() < 0);
    n.apply(100);
    EXPECT_EQ(100, n.syn());
}